

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O1

tiles_t * read_tiles(tiles_t *__return_storage_ptr__,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *tokens)

{
  int iVar1;
  ulong uVar2;
  undefined8 __nptr;
  long lVar3;
  mapped_type *__dest;
  int *piVar4;
  ulonglong uVar5;
  invalid_argument *this;
  int iVar6;
  ulong uVar7;
  pointer this_00;
  char *local_300;
  undefined1 local_2f8 [18];
  undefined2 auStack_2e6 [7];
  char local_2d8 [24];
  undefined1 auStack_2c0 [24];
  char acStack_2a8 [36];
  undefined1 auStack_284 [24];
  char local_26c [212];
  generic_tile_t<10UL> local_198;
  
  (__return_storage_ptr__->_M_h)._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = (tokens->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_198.data._M_elems[8]._M_elems[8] = '\0';
  local_198.data._M_elems[8]._M_elems[9] = '\0';
  local_198.data._M_elems[9]._M_elems[0] = '\0';
  local_198.data._M_elems[9]._M_elems[1] = '\0';
  local_198.data._M_elems[9]._M_elems[2] = '\0';
  local_198.data._M_elems[9]._M_elems[3] = '\0';
  local_198.data._M_elems[9]._M_elems[4] = '\0';
  local_198.data._M_elems[9]._M_elems[5] = '\0';
  local_198.data._M_elems[9]._M_elems[6] = '\0';
  local_198.data._M_elems[9]._M_elems[7] = '\0';
  local_198.data._M_elems[9]._M_elems[8] = '\0';
  local_198.data._M_elems[9]._M_elems[9] = '\0';
  local_198.data._M_elems[7]._M_elems[2] = '\0';
  local_198.data._M_elems[7]._M_elems[3] = '\0';
  local_198.data._M_elems[7]._M_elems[4] = '\0';
  local_198.data._M_elems[7]._M_elems[5] = '\0';
  local_198.data._M_elems[7]._M_elems[6] = '\0';
  local_198.data._M_elems[7]._M_elems[7] = '\0';
  local_198.data._M_elems[7]._M_elems[8] = '\0';
  local_198.data._M_elems[7]._M_elems[9] = '\0';
  local_198.data._M_elems[8]._M_elems[0] = '\0';
  local_198.data._M_elems[8]._M_elems[1] = '\0';
  local_198.data._M_elems[8]._M_elems[2] = '\0';
  local_198.data._M_elems[8]._M_elems[3] = '\0';
  local_198.data._M_elems[8]._M_elems[4] = '\0';
  local_198.data._M_elems[8]._M_elems[5] = '\0';
  local_198.data._M_elems[8]._M_elems[6] = '\0';
  local_198.data._M_elems[8]._M_elems[7] = '\0';
  local_198.data._M_elems[5]._M_elems[6] = '\0';
  local_198.data._M_elems[5]._M_elems[7] = '\0';
  local_198.data._M_elems[5]._M_elems[8] = '\0';
  local_198.data._M_elems[5]._M_elems[9] = '\0';
  local_198.data._M_elems[6]._M_elems[0] = '\0';
  local_198.data._M_elems[6]._M_elems[1] = '\0';
  local_198.data._M_elems[6]._M_elems[2] = '\0';
  local_198.data._M_elems[6]._M_elems[3] = '\0';
  local_198.data._M_elems[6]._M_elems[4] = '\0';
  local_198.data._M_elems[6]._M_elems[5] = '\0';
  local_198.data._M_elems[6]._M_elems[6] = '\0';
  local_198.data._M_elems[6]._M_elems[7] = '\0';
  local_198.data._M_elems[6]._M_elems[8] = '\0';
  local_198.data._M_elems[6]._M_elems[9] = '\0';
  local_198.data._M_elems[7]._M_elems[0] = '\0';
  local_198.data._M_elems[7]._M_elems[1] = '\0';
  local_198.data._M_elems[4]._M_elems[0] = '\0';
  local_198.data._M_elems[4]._M_elems[1] = '\0';
  local_198.data._M_elems[4]._M_elems[2] = '\0';
  local_198.data._M_elems[4]._M_elems[3] = '\0';
  local_198.data._M_elems[4]._M_elems[4] = '\0';
  local_198.data._M_elems[4]._M_elems[5] = '\0';
  local_198.data._M_elems[4]._M_elems[6] = '\0';
  local_198.data._M_elems[4]._M_elems[7] = '\0';
  local_198.data._M_elems[4]._M_elems[8] = '\0';
  local_198.data._M_elems[4]._M_elems[9] = '\0';
  local_198.data._M_elems[5]._M_elems[0] = '\0';
  local_198.data._M_elems[5]._M_elems[1] = '\0';
  local_198.data._M_elems[5]._M_elems[2] = '\0';
  local_198.data._M_elems[5]._M_elems[3] = '\0';
  local_198.data._M_elems[5]._M_elems[4] = '\0';
  local_198.data._M_elems[5]._M_elems[5] = '\0';
  local_198.data._M_elems[2]._M_elems[4] = '\0';
  local_198.data._M_elems[2]._M_elems[5] = '\0';
  local_198.data._M_elems[2]._M_elems[6] = '\0';
  local_198.data._M_elems[2]._M_elems[7] = '\0';
  local_198.data._M_elems[2]._M_elems[8] = '\0';
  local_198.data._M_elems[2]._M_elems[9] = '\0';
  local_198.data._M_elems[3]._M_elems[0] = '\0';
  local_198.data._M_elems[3]._M_elems[1] = '\0';
  local_198.data._M_elems[3]._M_elems[2] = '\0';
  local_198.data._M_elems[3]._M_elems[3] = '\0';
  local_198.data._M_elems[3]._M_elems[4] = '\0';
  local_198.data._M_elems[3]._M_elems[5] = '\0';
  local_198.data._M_elems[3]._M_elems[6] = '\0';
  local_198.data._M_elems[3]._M_elems[7] = '\0';
  local_198.data._M_elems[3]._M_elems[8] = '\0';
  local_198.data._M_elems[3]._M_elems[9] = '\0';
  local_198.data._M_elems[0]._M_elems[8] = '\0';
  local_198.data._M_elems[0]._M_elems[9] = '\0';
  local_198.data._M_elems[1]._M_elems[0] = '\0';
  local_198.data._M_elems[1]._M_elems[1] = '\0';
  local_198.data._M_elems[1]._M_elems[2] = '\0';
  local_198.data._M_elems[1]._M_elems[3] = '\0';
  local_198.data._M_elems[1]._M_elems[4] = '\0';
  local_198.data._M_elems[1]._M_elems[5] = '\0';
  local_198.data._M_elems[1]._M_elems[6] = '\0';
  local_198.data._M_elems[1]._M_elems[7] = '\0';
  local_198.data._M_elems[1]._M_elems[8] = '\0';
  local_198.data._M_elems[1]._M_elems[9] = '\0';
  local_198.data._M_elems[2]._M_elems[0] = '\0';
  local_198.data._M_elems[2]._M_elems[1] = '\0';
  local_198.data._M_elems[2]._M_elems[2] = '\0';
  local_198.data._M_elems[2]._M_elems[3] = '\0';
  local_198.id = 0;
  local_198.data._M_elems[0]._M_elems[0] = '\0';
  local_198.data._M_elems[0]._M_elems[1] = '\0';
  local_198.data._M_elems[0]._M_elems[2] = '\0';
  local_198.data._M_elems[0]._M_elems[3] = '\0';
  local_198.data._M_elems[0]._M_elems[4] = '\0';
  local_198.data._M_elems[0]._M_elems[5] = '\0';
  local_198.data._M_elems[0]._M_elems[6] = '\0';
  local_198.data._M_elems[0]._M_elems[7] = '\0';
  local_198.edges._M_elems[0]._M_elems[0] = '\0';
  local_198.edges._M_elems[0]._M_elems[1] = '\0';
  local_198.edges._M_elems[0]._M_elems[2] = '\0';
  local_198.edges._M_elems[0]._M_elems[3] = '\0';
  local_198.edges._M_elems[0]._M_elems[4] = '\0';
  local_198.edges._M_elems[0]._M_elems[5] = '\0';
  local_198.edges._M_elems[0]._M_elems[6] = '\0';
  local_198.edges._M_elems[0]._M_elems[7] = '\0';
  local_198.edges._M_elems[0]._M_elems[8] = '\0';
  local_198.edges._M_elems[0]._M_elems[9] = '\0';
  local_198.edges._M_elems[1]._M_elems[0] = '\0';
  local_198.edges._M_elems[1]._M_elems[1] = '\0';
  local_198.edges._M_elems[1]._M_elems[2] = '\0';
  local_198.edges._M_elems[1]._M_elems[3] = '\0';
  local_198.edges._M_elems[1]._M_elems[4] = '\0';
  local_198.edges._M_elems[1]._M_elems[5] = '\0';
  local_198.edges._M_elems[1]._M_elems[6] = '\0';
  local_198.edges._M_elems[1]._M_elems[7] = '\0';
  local_198.edges._M_elems[1]._M_elems[8] = '\0';
  local_198.edges._M_elems[1]._M_elems[9] = '\0';
  local_198.edges._M_elems[2]._M_elems[0] = '\0';
  local_198.edges._M_elems[2]._M_elems[1] = '\0';
  local_198.edges._M_elems[2]._M_elems[2] = '\0';
  local_198.edges._M_elems[2]._M_elems[3] = '\0';
  local_198.edges._M_elems[2]._M_elems[4] = '\0';
  local_198.edges._M_elems[2]._M_elems[5] = '\0';
  local_198.edges._M_elems[2]._M_elems[6] = '\0';
  local_198.edges._M_elems[2]._M_elems[7] = '\0';
  local_198.edges._M_elems[2]._M_elems[8] = '\0';
  local_198.edges._M_elems[2]._M_elems[9] = '\0';
  local_198.edges._M_elems[3]._M_elems[0] = '\0';
  local_198.edges._M_elems[3]._M_elems[1] = '\0';
  local_198.edges._M_elems[3]._M_elems[2] = '\0';
  local_198.edges._M_elems[3]._M_elems[3] = '\0';
  local_198.edges._M_elems[3]._M_elems[4] = '\0';
  local_198.edges._M_elems[3]._M_elems[5] = '\0';
  local_198.edges._M_elems[3]._M_elems[6] = '\0';
  local_198.edges._M_elems[3]._M_elems[7] = '\0';
  local_198.edges._M_elems[3]._M_elems[8] = '\0';
  local_198.edges._M_elems[3]._M_elems[9] = '\0';
  local_198.edges._M_elems[4]._M_elems[0] = '\0';
  local_198.edges._M_elems[4]._M_elems[1] = '\0';
  local_198.edges._M_elems[4]._M_elems[2] = '\0';
  local_198.edges._M_elems[4]._M_elems[3] = '\0';
  local_198.edges._M_elems[4]._M_elems[4] = '\0';
  local_198.edges._M_elems[4]._M_elems[5] = '\0';
  local_198.edges._M_elems[4]._M_elems[6] = '\0';
  local_198.edges._M_elems[4]._M_elems[7] = '\0';
  local_198.edges._M_elems[4]._M_elems[8] = '\0';
  local_198.edges._M_elems[4]._M_elems[9] = '\0';
  local_198.edges._M_elems[5]._M_elems[0] = '\0';
  local_198.edges._M_elems[5]._M_elems[1] = '\0';
  local_198.edges._M_elems[5]._M_elems[2] = '\0';
  local_198.edges._M_elems[5]._M_elems[3] = '\0';
  local_198.edges._M_elems[5]._M_elems[4] = '\0';
  local_198.edges._M_elems[5]._M_elems[5] = '\0';
  local_198.edges._M_elems[5]._M_elems[6] = '\0';
  local_198.edges._M_elems[5]._M_elems[7] = '\0';
  local_198.edges._M_elems[5]._M_elems[8] = '\0';
  local_198.edges._M_elems[5]._M_elems[9] = '\0';
  local_198.edges._M_elems[6]._M_elems[0] = '\0';
  local_198.edges._M_elems[6]._M_elems[1] = '\0';
  local_198.edges._M_elems[6]._M_elems[2] = '\0';
  local_198.edges._M_elems[6]._M_elems[3] = '\0';
  local_198.edges._M_elems[6]._M_elems[4] = '\0';
  local_198.edges._M_elems[6]._M_elems[5] = '\0';
  local_198.edges._M_elems[6]._M_elems[6] = '\0';
  local_198.edges._M_elems[6]._M_elems[7] = '\0';
  local_198.edges._M_elems[6]._M_elems[8] = '\0';
  local_198.edges._M_elems[6]._M_elems[9] = '\0';
  local_198.edges._M_elems[7]._M_elems[0] = '\0';
  local_198.edges._M_elems[7]._M_elems[1] = '\0';
  local_198.edges._M_elems[7]._M_elems[2] = '\0';
  local_198.edges._M_elems[7]._M_elems[3] = '\0';
  local_198.edges._M_elems[7]._M_elems[4] = '\0';
  local_198.edges._M_elems[7]._M_elems[5] = '\0';
  local_198.edges._M_elems[7]._M_elems[6] = '\0';
  local_198.edges._M_elems[7]._M_elems[7] = '\0';
  local_198.edges._M_elems[7]._M_elems[8] = '\0';
  local_198.edges._M_elems[7]._M_elems[9] = '\0';
  iVar6 = 0;
  memset(&local_198.corners,0,0xa0);
  if (this_00 !=
      (tokens->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar2 = this_00->_M_string_length;
      if (uVar2 == 0) {
        if (iVar6 == 10) {
          generic_tile_t<10UL>::make_edges((edges_t *)local_2f8,&local_198);
          memcpy(&local_198.edges,(corners_t *)local_2f8,0x50);
          generic_tile_t<10UL>::make_corners((corners_t *)local_2f8,&local_198);
          lVar3 = 0;
          do {
            *(undefined2 *)(local_198.corners._M_elems[0].first._M_elems + lVar3 + 8) =
                 *(undefined2 *)(local_2f8 + lVar3 + 8);
            *(undefined8 *)(local_198.corners._M_elems[0].first._M_elems + lVar3) =
                 *(undefined8 *)(local_2f8 + lVar3);
            *(undefined8 *)(local_198.corners._M_elems[0].second._M_elems + lVar3) =
                 *(undefined8 *)(local_2f8 + lVar3 + 10);
            *(undefined2 *)(local_198.corners._M_elems[0].second._M_elems + lVar3 + 8) =
                 *(undefined2 *)((long)auStack_2e6 + lVar3);
            lVar3 = lVar3 + 0x14;
          } while (lVar3 != 0xa0);
          __dest = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)__return_storage_ptr__,&local_198.id);
          memcpy(__dest,&local_198,0xbc);
          lVar3 = 0;
          do {
            *(undefined2 *)((__dest->corners)._M_elems[0].first._M_elems + lVar3 + 8) =
                 *(undefined2 *)(local_198.corners._M_elems[0].first._M_elems + lVar3 + 8);
            *(undefined8 *)((__dest->corners)._M_elems[0].first._M_elems + lVar3) =
                 *(undefined8 *)(local_198.corners._M_elems[0].first._M_elems + lVar3);
            *(undefined8 *)((__dest->corners)._M_elems[0].second._M_elems + lVar3) =
                 *(undefined8 *)(local_198.corners._M_elems[0].second._M_elems + lVar3);
            *(undefined2 *)((__dest->corners)._M_elems[0].second._M_elems + lVar3 + 8) =
                 *(undefined2 *)(local_198.corners._M_elems[0].second._M_elems + lVar3 + 8);
            lVar3 = lVar3 + 0x14;
          } while (lVar3 != 0xa0);
        }
        acStack_2a8[0x10] = '\0';
        acStack_2a8[0x11] = '\0';
        acStack_2a8[0x12] = '\0';
        acStack_2a8[0x13] = '\0';
        acStack_2a8[0x14] = '\0';
        acStack_2a8[0x15] = '\0';
        acStack_2a8[0x16] = '\0';
        acStack_2a8[0x17] = '\0';
        acStack_2a8[0x18] = '\0';
        acStack_2a8[0x19] = '\0';
        acStack_2a8[0x1a] = '\0';
        acStack_2a8[0x1b] = '\0';
        acStack_2a8[0] = '\0';
        acStack_2a8[1] = '\0';
        acStack_2a8[2] = '\0';
        acStack_2a8[3] = '\0';
        acStack_2a8[4] = '\0';
        acStack_2a8[5] = '\0';
        acStack_2a8[6] = '\0';
        acStack_2a8[7] = '\0';
        acStack_2a8[8] = '\0';
        acStack_2a8[9] = '\0';
        acStack_2a8[10] = '\0';
        acStack_2a8[0xb] = '\0';
        acStack_2a8[0xc] = '\0';
        acStack_2a8[0xd] = '\0';
        acStack_2a8[0xe] = '\0';
        acStack_2a8[0xf] = '\0';
        auStack_2c0[8] = '\0';
        auStack_2c0[9] = '\0';
        auStack_2c0[10] = '\0';
        auStack_2c0[0xb] = '\0';
        auStack_2c0[0xc] = '\0';
        auStack_2c0[0xd] = '\0';
        auStack_2c0[0xe] = '\0';
        auStack_2c0[0xf] = '\0';
        auStack_2c0[0x10] = '\0';
        auStack_2c0[0x11] = '\0';
        auStack_2c0[0x12] = '\0';
        auStack_2c0[0x13] = '\0';
        auStack_2c0[0x14] = '\0';
        auStack_2c0[0x15] = '\0';
        auStack_2c0[0x16] = '\0';
        auStack_2c0[0x17] = '\0';
        local_2d8[0x10] = '\0';
        local_2d8[0x11] = '\0';
        local_2d8[0x12] = '\0';
        local_2d8[0x13] = '\0';
        local_2d8[0x14] = '\0';
        local_2d8[0x15] = '\0';
        local_2d8[0x16] = '\0';
        local_2d8[0x17] = '\0';
        auStack_2c0[0] = '\0';
        auStack_2c0[1] = '\0';
        auStack_2c0[2] = '\0';
        auStack_2c0[3] = '\0';
        auStack_2c0[4] = '\0';
        auStack_2c0[5] = '\0';
        auStack_2c0[6] = '\0';
        auStack_2c0[7] = '\0';
        local_2d8[0] = '\0';
        local_2d8[1] = '\0';
        local_2d8[2] = '\0';
        local_2d8[3] = '\0';
        local_2d8[4] = '\0';
        local_2d8[5] = '\0';
        local_2d8[6] = '\0';
        local_2d8[7] = '\0';
        local_2d8[8] = '\0';
        local_2d8[9] = '\0';
        local_2d8[10] = '\0';
        local_2d8[0xb] = '\0';
        local_2d8[0xc] = '\0';
        local_2d8[0xd] = '\0';
        local_2d8[0xe] = '\0';
        local_2d8[0xf] = '\0';
        stack0xfffffffffffffd18 = 0;
        auStack_2e6._6_8_ = 0;
        local_2f8._0_8_ = (char *)0x0;
        local_2f8._8_8_ = 0;
        local_26c[0x20] = '\0';
        local_26c[0x21] = '\0';
        local_26c[0x22] = '\0';
        local_26c[0x23] = '\0';
        local_26c[0x24] = '\0';
        local_26c[0x25] = '\0';
        local_26c[0x26] = '\0';
        local_26c[0x27] = '\0';
        local_26c[0x28] = '\0';
        local_26c[0x29] = '\0';
        local_26c[0x2a] = '\0';
        local_26c[0x2b] = '\0';
        local_26c[0x2c] = '\0';
        local_26c[0x2d] = '\0';
        local_26c[0x2e] = '\0';
        local_26c[0x2f] = '\0';
        local_26c[0x10] = '\0';
        local_26c[0x11] = '\0';
        local_26c[0x12] = '\0';
        local_26c[0x13] = '\0';
        local_26c[0x14] = '\0';
        local_26c[0x15] = '\0';
        local_26c[0x16] = '\0';
        local_26c[0x17] = '\0';
        local_26c[0x18] = '\0';
        local_26c[0x19] = '\0';
        local_26c[0x1a] = '\0';
        local_26c[0x1b] = '\0';
        local_26c[0x1c] = '\0';
        local_26c[0x1d] = '\0';
        local_26c[0x1e] = '\0';
        local_26c[0x1f] = '\0';
        local_26c[0] = '\0';
        local_26c[1] = '\0';
        local_26c[2] = '\0';
        local_26c[3] = '\0';
        local_26c[4] = '\0';
        local_26c[5] = '\0';
        local_26c[6] = '\0';
        local_26c[7] = '\0';
        local_26c[8] = '\0';
        local_26c[9] = '\0';
        local_26c[10] = '\0';
        local_26c[0xb] = '\0';
        local_26c[0xc] = '\0';
        local_26c[0xd] = '\0';
        local_26c[0xe] = '\0';
        local_26c[0xf] = '\0';
        auStack_284[8] = '\0';
        auStack_284[9] = '\0';
        auStack_284[10] = '\0';
        auStack_284[0xb] = '\0';
        auStack_284[0xc] = '\0';
        auStack_284[0xd] = '\0';
        auStack_284[0xe] = '\0';
        auStack_284[0xf] = '\0';
        auStack_284[0x10] = '\0';
        auStack_284[0x11] = '\0';
        auStack_284[0x12] = '\0';
        auStack_284[0x13] = '\0';
        auStack_284[0x14] = '\0';
        auStack_284[0x15] = '\0';
        auStack_284[0x16] = '\0';
        auStack_284[0x17] = '\0';
        acStack_2a8[0x1c] = '\0';
        acStack_2a8[0x1d] = '\0';
        acStack_2a8[0x1e] = '\0';
        acStack_2a8[0x1f] = '\0';
        acStack_2a8[0x20] = '\0';
        acStack_2a8[0x21] = '\0';
        acStack_2a8[0x22] = '\0';
        acStack_2a8[0x23] = '\0';
        auStack_284[0] = '\0';
        auStack_284[1] = '\0';
        auStack_284[2] = '\0';
        auStack_284[3] = '\0';
        auStack_284[4] = '\0';
        auStack_284[5] = '\0';
        auStack_284[6] = '\0';
        auStack_284[7] = '\0';
        memset(local_26c + 0x30,0,0xa0);
        lVar3 = 0xbc;
        memcpy(&local_198,(corners_t *)local_2f8,0xbc);
        do {
          *(undefined2 *)(local_198.data._M_elems[0]._M_elems + lVar3) =
               *(undefined2 *)(local_2f8 + lVar3 + 8);
          *(undefined8 *)(local_198.data._M_elems[0]._M_elems + lVar3 + -8) =
               *(undefined8 *)(local_2f8 + lVar3);
          *(undefined8 *)(local_198.data._M_elems[0]._M_elems + lVar3 + 2) =
               *(undefined8 *)(local_2f8 + lVar3 + 10);
          *(undefined2 *)(local_198.data._M_elems[1]._M_elems + lVar3) =
               *(undefined2 *)((long)auStack_2e6 + lVar3);
          lVar3 = lVar3 + 0x14;
        } while (lVar3 != 0x15c);
        iVar6 = 0;
      }
      else {
        piVar4 = (int *)(this_00->_M_dataplus)._M_p;
        if ((uVar2 < 5) || ((char)piVar4[1] != ' ' || *piVar4 != 0x656c6954)) {
          if (0 < (long)uVar2) {
            uVar7 = 0;
            do {
              local_198.data._M_elems[iVar6]._M_elems[uVar7] = *(char *)((long)piVar4 + uVar7);
              uVar7 = uVar7 + 1;
            } while (uVar2 != uVar7);
          }
          iVar6 = iVar6 + 1;
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                     this_00,5,this_00->_M_string_length - 6);
          __nptr = local_2f8._0_8_;
          piVar4 = __errno_location();
          iVar1 = *piVar4;
          *piVar4 = 0;
          uVar5 = strtoull((char *)__nptr,&local_300,10);
          if (local_300 == (char *)__nptr) {
            std::__throw_invalid_argument("stoull");
LAB_00102a1a:
            std::__throw_out_of_range("stoull");
            goto LAB_00102a26;
          }
          if (*piVar4 == 0) {
            *piVar4 = iVar1;
          }
          else if (*piVar4 == 0x22) goto LAB_00102a1a;
          local_198.id = uVar5;
          if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
            operator_delete((void *)local_2f8._0_8_,stack0xfffffffffffffd18 + 1);
          }
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             (tokens->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    if (iVar6 != 0) {
LAB_00102a26:
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this,"Unprocessed data, did you end with an empty line?");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tiles_t read_tiles(const std::vector<std::string>& tokens) {
  auto tiles = tiles_t {};

  auto it = tokens.cbegin();
  auto tile = tile_t {};
  static constexpr auto id_prefix = std::string_view {"Tile "};
  auto row = 0;
  while (it != tokens.cend()) {
    if (it->empty()) { // make sure to end with an empty line
      if (row == 10) {
        tile.edges = tile.make_edges();
        tile.corners = tile.make_corners();
        tiles[tile.id] = tile;
      }
      row = 0;
      tile = {};
    } else if (it->starts_with(id_prefix)) {
      tile.id = std::stoull(it->substr(id_prefix.size(), it->size() - id_prefix.size()-1));
    } else {
      ranges::copy(*it, tile.data[row++].begin());
    }

    it++;
  }
  if (row != 0) {
    throw std::invalid_argument("Unprocessed data, did you end with an empty line?");
  }

  return tiles;
}